

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_test.cxx
# Opt level: O0

void test<cryptox::message_digest_algorithm<&EVP_sha1,160ul>>
               (size_t bits,string *key,string *salt,size_t rounds,string *expected)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  cryptox local_100 [32];
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d0;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string *expected_local;
  size_t rounds_local;
  string *salt_local;
  string *key_local;
  size_t bits_local;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)expected;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58._M_current = (char *)std::__cxx11::string::end();
  local_60._M_current = (char *)std::__cxx11::string::begin();
  local_68._M_current = (char *)std::__cxx11::string::end();
  local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_88 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             cryptox::
             pbkdf2<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (local_50,local_58,local_60,local_68,rounds,
                        (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )local_70,bits);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
               ,0x74);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0x22,&local_a8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d0,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
               ,0x74);
    cryptox::to_hex<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (local_100,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_d0,&local_e0,0x22,1,2,local_100,"to_hex(result)",
               result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,"expected");
    std::__cxx11::string::~string((string *)local_100);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void test(
	const size_t       bits,
	const std::string& key,
	const std::string& salt,
	const size_t       rounds,
	const std::string& expected
) {
	std::vector<std::uint8_t> result;

	pbkdf2<Algorithm>(key .begin(), key .end(),
	                  salt.begin(), salt.end(),
	                  rounds,
	                  std::back_inserter(result),
	                  bits);

	BOOST_CHECK_EQUAL(to_hex(result), expected);
}